

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.h
# Opt level: O2

char * AGSMock::Call<char_const*,SockAddr*>(char *name,SockAddr *args)

{
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  MissingFunction *this;
  
  UNRECOVERED_JUMPTABLE = (code *)GetFunction(name);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    pcVar1 = (char *)(*UNRECOVERED_JUMPTABLE)(args);
    return pcVar1;
  }
  this = (MissingFunction *)__cxa_allocate_exception(0x10);
  MissingFunction::MissingFunction(this,name);
  __cxa_throw(this,&MissingFunction::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Call(const char *name, Args... args)
{
	void *ptr = GetFunction(name);
	if (ptr == nullptr) throw MissingFunction(name);
	T (*func)(Args...);
	*(reinterpret_cast<void **> (&func)) = ptr;
	return func(args...);
}